

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Address.cpp
# Opt level: O0

bool __thiscall Network::Address::URL::findQueryVariable(URL *this,String *name,String *value)

{
  bool bVar1;
  uchar uVar2;
  CharWriteProtected CVar3;
  String local_150;
  String local_140;
  undefined1 local_130 [96];
  String local_d0;
  BaseAddress local_c0;
  uint local_b8;
  anon_union_16_3_a3f0114d_for___in6_u local_b0;
  String local_a0;
  String local_90;
  String local_80;
  String local_70;
  byte local_59;
  undefined1 local_58 [7];
  bool start;
  String queryClean;
  undefined1 local_38 [24];
  String *value_local;
  String *name_local;
  URL *this_local;
  
  local_38._16_8_ = value;
  value_local = name;
  name_local = (String *)this;
  escapedURI((URL *)local_38,name,QueryOnly,true);
  Bstrlib::String::operator=(name,(String *)local_38);
  Bstrlib::String::~String((String *)local_38);
  Bstrlib::String::String((String *)local_58,&this->query);
  Bstrlib::String::getLength(name);
  Bstrlib::String::midString(&local_70,(int)local_58,0);
  bVar1 = Bstrlib::String::operator==(&local_70,name);
  Bstrlib::String::~String(&local_70);
  local_59 = bVar1;
  if (bVar1) {
    Bstrlib::String::getLength(name);
    Bstrlib::String::splitAt(&local_a0,(int)local_58);
    Bstrlib::String::~String(&local_a0);
  }
  else {
    Bstrlib::operator+((Bstrlib *)&local_90,"&",name);
    Bstrlib::String::fromFirst(&local_80,&this->query,SUB81(&local_90,0));
    Bstrlib::String::operator=((String *)local_58,&local_80);
    Bstrlib::String::~String(&local_80);
    Bstrlib::String::~String(&local_90);
  }
  if (((local_59 & 1) != 0) ||
     (bVar1 = Bstrlib::String::operator_cast_to_bool((String *)local_58), bVar1)) {
    CVar3 = Bstrlib::String::operator[]((String *)local_58,0);
    local_c0._vptr_BaseAddress = (_func_int **)CVar3.s;
    local_b8 = CVar3.idx;
    local_b0._0_8_ = local_c0._vptr_BaseAddress;
    local_b0.__u6_addr32[2] = local_b8;
    uVar2 = Bstrlib::CharWriteProtected::operator_cast_to_unsigned_char
                      ((CharWriteProtected *)&local_b0);
    if (uVar2 == '=') {
      Bstrlib::String::splitAt(&local_d0,(int)local_58);
      Bstrlib::String::~String(&local_d0);
      Bstrlib::String::String((String *)(local_130 + 0x30),"&");
      Bstrlib::String::upToFirst((String *)(local_130 + 0x40),(String *)local_58,false);
      unescapedURI((URL *)(local_130 + 0x50),(String *)(local_130 + 0x40));
      Bstrlib::String::operator=((String *)local_38._16_8_,(String *)(local_130 + 0x50));
      Bstrlib::String::~String((String *)(local_130 + 0x50));
      Bstrlib::String::~String((String *)(local_130 + 0x40));
      Bstrlib::String::~String((String *)(local_130 + 0x30));
    }
    else {
      Bstrlib::String::midString((String *)(local_130 + 0x20),(int)local_58,0);
      bVar1 = Bstrlib::String::operator==((String *)(local_130 + 0x20),"[]=");
      Bstrlib::String::~String((String *)(local_130 + 0x20));
      if (bVar1) {
        Bstrlib::String::splitAt((String *)(local_130 + 0x10),(int)local_58);
        Bstrlib::String::~String((String *)(local_130 + 0x10));
        Bstrlib::String::String(&local_150,"&");
        Bstrlib::String::upToFirst(&local_140,(String *)local_58,SUB81(&local_150,0));
        unescapedURI((URL *)local_130,&local_140);
        Bstrlib::String::operator=((String *)local_38._16_8_,(String *)local_130);
        Bstrlib::String::~String((String *)local_130);
        Bstrlib::String::~String(&local_140);
        Bstrlib::String::~String(&local_150);
      }
    }
    this_local._7_1_ = 1;
  }
  else {
    this_local._7_1_ = 0;
  }
  Bstrlib::String::~String((String *)local_58);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool URL::findQueryVariable(String name, String & value) const
        {
            name = escapedURI(name, QueryOnly);
            String queryClean = query;
            bool start = queryClean.midString(0, name.getLength()) == name;
            if (!start) queryClean = query.fromFirst("&" + name);
            else queryClean.splitAt(name.getLength());
            if ( start || queryClean )
            {
                if (queryClean[0] == '=') { queryClean.splitAt(1); value = unescapedURI(queryClean.upToFirst("&")); }
                else if (queryClean.midString(0, 2) == "[]=") { queryClean.splitAt(3); value = unescapedURI(queryClean.upToFirst("&")); }
                return true;
            }
            return false;
        }